

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int fsg_model_add_alt(fsg_model_t *fsg,char *baseword,char *altword)

{
  undefined4 *puVar1;
  int iVar2;
  bitvec_t *pbVar3;
  undefined4 *ptr;
  fsg_link_t *link;
  fsg_link_t *fl;
  gnode_t *gn;
  glist_t trans;
  hash_iter_t *itor;
  int ntrans;
  int altwid;
  int basewid;
  int i;
  char *altword_local;
  char *baseword_local;
  fsg_model_t *fsg_local;
  
  ntrans = 0;
  while ((ntrans < fsg->n_word && (iVar2 = strcmp(fsg->vocab[ntrans],baseword), iVar2 != 0))) {
    ntrans = ntrans + 1;
  }
  if (ntrans == fsg->n_word) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x1b9,"Base word %s not present in FSG vocabulary!\n",baseword);
    fsg_local._4_4_ = -1;
  }
  else {
    iVar2 = fsg_model_word_add(fsg,altword);
    if (fsg->altwords == (bitvec_t *)0x0) {
      pbVar3 = (bitvec_t *)
               __ckd_calloc__((long)((fsg->n_word_alloc + 0x1f) / 0x20),4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                              ,0x1be);
      fsg->altwords = pbVar3;
    }
    fsg->altwords[iVar2 / 0x20] = fsg->altwords[iVar2 / 0x20] | (uint)(1L << ((byte)iVar2 & 0x1f));
    if ((fsg->silwords != (bitvec_t *)0x0) &&
       (((ulong)fsg->silwords[ntrans / 0x20] & 1L << ((byte)ntrans & 0x1f)) != 0)) {
      if (fsg->silwords == (bitvec_t *)0x0) {
        pbVar3 = (bitvec_t *)
                 __ckd_calloc__((long)((fsg->n_word_alloc + 0x1f) / 0x20),4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                ,0x1c2);
        fsg->silwords = pbVar3;
      }
      fsg->silwords[iVar2 / 0x20] = fsg->silwords[iVar2 / 0x20] | (uint)(1L << ((byte)iVar2 & 0x1f))
      ;
    }
    itor._0_4_ = 0;
    for (altwid = 0; altwid < fsg->n_state; altwid = altwid + 1) {
      if (fsg->trans[altwid].trans != (hash_table_t *)0x0) {
        for (trans = (glist_t)hash_table_iter(fsg->trans[altwid].trans); trans != (glist_t)0x0;
            trans = (glist_t)hash_table_iter_next((hash_iter_t *)trans)) {
          fl = (fsg_link_t *)trans->next[1].data.ptr;
          gn = (gnode_t *)fl;
          for (; fl != (fsg_link_t *)0x0; fl = *(fsg_link_t **)&fl->logs2prob) {
            puVar1 = *(undefined4 **)fl;
            if (puVar1[3] == ntrans) {
              ptr = (undefined4 *)
                    __listelem_malloc__(fsg->link_alloc,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                        ,0x1dc);
              *ptr = *puVar1;
              ptr[1] = puVar1[1];
              ptr[2] = puVar1[2];
              ptr[3] = iVar2;
              gn = glist_add_ptr(gn,ptr);
              itor._0_4_ = (int)itor + 1;
            }
          }
          trans->next[1].data.ptr = gn;
        }
      }
    }
    fsg_local._4_4_ = (int)itor;
  }
  return fsg_local._4_4_;
}

Assistant:

int
fsg_model_add_alt(fsg_model_t * fsg, char const *baseword,
                  char const *altword)
{
    int i, basewid, altwid;
    int ntrans;

    /* FIXME: This will get slow, eventually... */
    for (basewid = 0; basewid < fsg->n_word; ++basewid)
        if (0 == strcmp(fsg->vocab[basewid], baseword))
            break;
    if (basewid == fsg->n_word) {
        E_ERROR("Base word %s not present in FSG vocabulary!\n", baseword);
        return -1;
    }
    altwid = fsg_model_word_add(fsg, altword);
    if (fsg->altwords == NULL)
        fsg->altwords = bitvec_alloc(fsg->n_word_alloc);
    bitvec_set(fsg->altwords, altwid);
    if (fsg_model_is_filler(fsg, basewid)) {
        if (fsg->silwords == NULL)
            fsg->silwords = bitvec_alloc(fsg->n_word_alloc);
        bitvec_set(fsg->silwords, altwid);
    }

    E_DEBUG("Adding alternate word transitions (%s,%s) to FSG\n",
            baseword, altword);

    /* Look for all transitions involving baseword and duplicate them. */
    /* FIXME: This will also get slow, eventually... */
    ntrans = 0;
    for (i = 0; i < fsg->n_state; ++i) {
        hash_iter_t *itor;
        if (fsg->trans[i].trans == NULL)
            continue;
        for (itor = hash_table_iter(fsg->trans[i].trans); itor;
             itor = hash_table_iter_next(itor)) {
            glist_t trans;
            gnode_t *gn;

            trans = hash_entry_val(itor->ent);
            for (gn = trans; gn; gn = gnode_next(gn)) {
                fsg_link_t *fl = gnode_ptr(gn);
                if (fl->wid == basewid) {
                    fsg_link_t *link;

                    /* Create transition object */
                    link = listelem_malloc(fsg->link_alloc);
                    link->from_state = fl->from_state;
                    link->to_state = fl->to_state;
                    link->logs2prob = fl->logs2prob;    /* FIXME!!!??? */
                    link->wid = altwid;

                    trans = glist_add_ptr(trans, (void *) link);
                    ++ntrans;
                }
            }
            hash_entry_val(itor->ent) = trans;
        }
    }

    E_DEBUG("Added %d alternate word transitions\n", ntrans);
    return ntrans;
}